

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigSelectBestPat(Ivy_FraigMan_t *p)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  Ivy_FraigSim_t *pIVar2;
  int local_38;
  int local_34;
  int BestPat;
  int MaxScore;
  int nLimit;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_FraigSim_t *pSims;
  Ivy_FraigMan_t *p_local;
  
  local_34 = 0;
  local_38 = -1;
  for (MaxScore = 1; MaxScore < p->nSimWords << 5; MaxScore = MaxScore + 1) {
    if (local_34 < p->pPatScores[MaxScore]) {
      local_34 = p->pPatScores[MaxScore];
      local_38 = MaxScore;
    }
  }
  if (local_34 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    memset(p->pPatWords,0,(long)p->nPatWords << 2);
    for (MaxScore = 0; iVar1 = Vec_PtrSize(p->pManAig->vPis), MaxScore < iVar1;
        MaxScore = MaxScore + 1) {
      pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vPis,MaxScore);
      pIVar2 = Ivy_ObjSim(pObj_00);
      iVar1 = Ivy_InfoHasBit((uint *)(pIVar2 + 1),local_38);
      if (iVar1 != 0) {
        Ivy_InfoSetBit(p->pPatWords,MaxScore);
      }
    }
    p_local._4_4_ = local_34;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_FraigSelectBestPat( Ivy_FraigMan_t * p )
{
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, nLimit = p->nSimWords * 32, MaxScore = 0, BestPat = -1;
    for ( i = 1; i < nLimit; i++ )
    {
        if ( MaxScore < p->pPatScores[i] )
        {
            MaxScore = p->pPatScores[i];
            BestPat = i;
        }
    }
    if ( MaxScore == 0 )
        return 0;
//    if ( MaxScore > p->pParams->MaxScore )
//    printf( "Max score is %3d.  ", MaxScore );
    // copy the best pattern into the selected pattern
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pSims = Ivy_ObjSim(pObj);
        if ( Ivy_InfoHasBit(pSims->pData, BestPat) )
            Ivy_InfoSetBit(p->pPatWords, i);
    }
    return MaxScore;
}